

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::convert_separate_image_to_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t id)

{
  uint32_t id_00;
  SPIRVariable *pSVar1;
  CompilerError *this_00;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  CompilerGLSL *this_01;
  TypedID<(spirv_cross::Types)2> local_244;
  VariableID local_240;
  undefined1 local_23a;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [80];
  undefined1 local_180 [8];
  SPIRType sampled_type;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  this_01 = (CompilerGLSL *)CONCAT44(in_register_00000034,id);
  pSVar1 = Compiler::maybe_get_backing_variable((Compiler *)this_01,in_EDX);
  if (pSVar1 != (SPIRVariable *)0x0) {
    id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar1->super_IVariant).field_0xc);
    sampled_type.member_name_cache._M_h._M_single_bucket =
         (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>((Compiler *)this_01,id_00);
    if (((*(int *)&(((SPIRType *)sampled_type.member_name_cache._M_h._M_single_bucket)->
                   super_IVariant).field_0xc == 0x10) &&
        ((((SPIRType *)sampled_type.member_name_cache._M_h._M_single_bucket)->image).sampled == 1))
       && ((((SPIRType *)sampled_type.member_name_cache._M_h._M_single_bucket)->image).dim !=
           DimBuffer)) {
      if (((this_01->options).vulkan_semantics & 1U) == 0) {
        if ((this_01->super_Compiler).dummy_sampler_id != 0) {
          TypedID<(spirv_cross::Types)2>::TypedID(&local_240,in_EDX);
          TypedID<(spirv_cross::Types)2>::TypedID
                    (&local_244,(this_01->super_Compiler).dummy_sampler_id);
          to_combined_image_sampler_abi_cxx11_(this,(VariableID)id,local_240);
          return this;
        }
        local_23a = 1;
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_238,
                   "Cannot find dummy sampler ID. Was build_dummy_sampler_for_combined_images() called?"
                   ,&local_239);
        CompilerError::CompilerError(this_00,(string *)local_238);
        local_23a = 0;
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((this_01->super_Compiler).dummy_sampler_id != 0) {
        SPIRType::SPIRType((SPIRType *)local_180,
                           (SPIRType *)sampled_type.member_name_cache._M_h._M_single_bucket);
        sampled_type.super_IVariant._vptr_IVariant._4_4_ = 0x11;
        (*(this_01->super_Compiler)._vptr_Compiler[0x13])
                  (local_1d0 + 0x30,this_01,(SPIRType *)local_180,0);
        to_non_uniform_aware_expression_abi_cxx11_((CompilerGLSL *)local_1d0,id);
        to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_1f0,id,SUB41((this_01->super_Compiler).dummy_sampler_id,0))
        ;
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                  ((spirv_cross *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1d0 + 0x30),(char (*) [2])0x5cba12,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   (char (*) [3])0x5cb8ef,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                   (char (*) [2])0x5b48c4);
        ::std::__cxx11::string::~string((string *)local_1f0);
        ::std::__cxx11::string::~string((string *)local_1d0);
        ::std::__cxx11::string::~string((string *)(local_1d0 + 0x30));
        SPIRType::~SPIRType((SPIRType *)local_180);
        return this;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_210,"GL_EXT_samplerless_texture_functions",&local_211);
      require_extension_internal(this_01,(string *)local_210);
      ::std::__cxx11::string::~string(local_210);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_211);
    }
  }
  to_non_uniform_aware_expression_abi_cxx11_(this,id);
  return this;
}

Assistant:

std::string CompilerGLSL::convert_separate_image_to_expression(uint32_t id)
{
	auto *var = maybe_get_backing_variable(id);

	// If we are fetching from a plain OpTypeImage, we must combine with a dummy sampler in GLSL.
	// In Vulkan GLSL, we can make use of the newer GL_EXT_samplerless_texture_functions.
	if (var)
	{
		auto &type = get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (options.vulkan_semantics)
			{
				if (dummy_sampler_id)
				{
					// Don't need to consider Shadow state since the dummy sampler is always non-shadow.
					auto sampled_type = type;
					sampled_type.basetype = SPIRType::SampledImage;
					return join(type_to_glsl(sampled_type), "(", to_non_uniform_aware_expression(id), ", ",
					            to_expression(dummy_sampler_id), ")");
				}
				else
				{
					// Newer glslang supports this extension to deal with texture2D as argument to texture functions.
					require_extension_internal("GL_EXT_samplerless_texture_functions");
				}
			}
			else
			{
				if (!dummy_sampler_id)
					SPIRV_CROSS_THROW("Cannot find dummy sampler ID. Was "
					                  "build_dummy_sampler_for_combined_images() called?");

				return to_combined_image_sampler(id, dummy_sampler_id);
			}
		}
	}

	return to_non_uniform_aware_expression(id);
}